

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btOverlappingPairCache.cpp
# Opt level: O3

btBroadphasePair * __thiscall
btSortedOverlappingPairCache::addOverlappingPair
          (btSortedOverlappingPairCache *this,btBroadphaseProxy *proxy0,btBroadphaseProxy *proxy1)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  uint uVar3;
  btOverlapFilterCallback *pbVar4;
  btBroadphasePair *pbVar5;
  btOverlappingPairCallback *pbVar6;
  undefined8 uVar7;
  btBroadphaseProxy *pbVar8;
  int iVar9;
  uint uVar10;
  btBroadphasePair *pbVar11;
  long lVar12;
  btBroadphaseProxy *pbVar13;
  
  pbVar4 = this->m_overlapFilterCallback;
  if (pbVar4 == (btOverlapFilterCallback *)0x0) {
    if (((ushort)(proxy0->m_collisionFilterGroup & proxy1->m_collisionFilterMask) != 0) &&
       ((ushort)(proxy1->m_collisionFilterGroup & proxy0->m_collisionFilterMask) != 0))
    goto LAB_001381fd;
  }
  else {
    iVar9 = (*pbVar4->_vptr_btOverlapFilterCallback[2])(pbVar4,proxy0,proxy1);
    if ((char)iVar9 != '\0') {
LAB_001381fd:
      uVar3 = (this->m_overlappingPairArray).m_size;
      uVar10 = uVar3;
      if (uVar3 == (this->m_overlappingPairArray).m_capacity) {
        iVar9 = 1;
        if (uVar3 != 0) {
          iVar9 = uVar3 * 2;
        }
        if ((int)uVar3 < iVar9) {
          if (iVar9 == 0) {
            pbVar11 = (btBroadphasePair *)0x0;
          }
          else {
            pbVar11 = (btBroadphasePair *)btAlignedAllocInternal((long)iVar9 << 5,0x10);
            uVar10 = (this->m_overlappingPairArray).m_size;
          }
          if (0 < (int)uVar10) {
            lVar12 = 0;
            do {
              pbVar5 = (this->m_overlappingPairArray).m_data;
              puVar1 = (undefined8 *)((long)&pbVar5->m_pProxy0 + lVar12);
              uVar7 = puVar1[1];
              puVar2 = (undefined8 *)((long)&pbVar11->m_pProxy0 + lVar12);
              *puVar2 = *puVar1;
              puVar2[1] = uVar7;
              *(undefined8 *)((long)&pbVar11->m_algorithm + lVar12) =
                   *(undefined8 *)((long)&pbVar5->m_algorithm + lVar12);
              *(undefined8 *)((long)&pbVar11->field_3 + lVar12) =
                   *(undefined8 *)((long)&pbVar5->field_3 + lVar12);
              lVar12 = lVar12 + 0x20;
            } while ((ulong)uVar10 << 5 != lVar12);
          }
          pbVar5 = (this->m_overlappingPairArray).m_data;
          if ((pbVar5 != (btBroadphasePair *)0x0) &&
             ((this->m_overlappingPairArray).m_ownsMemory == true)) {
            btAlignedFreeInternal(pbVar5);
          }
          (this->m_overlappingPairArray).m_ownsMemory = true;
          (this->m_overlappingPairArray).m_data = pbVar11;
          (this->m_overlappingPairArray).m_capacity = iVar9;
          uVar10 = (this->m_overlappingPairArray).m_size;
        }
      }
      (this->m_overlappingPairArray).m_size = uVar10 + 1;
      pbVar13 = proxy0;
      pbVar8 = proxy1;
      if (proxy0->m_uniqueId < proxy1->m_uniqueId) {
        pbVar13 = proxy1;
        pbVar8 = proxy0;
      }
      pbVar11 = (this->m_overlappingPairArray).m_data;
      pbVar11[(int)uVar3].m_pProxy0 = pbVar8;
      pbVar11[(int)uVar3].m_pProxy1 = pbVar13;
      pbVar11[(int)uVar3].m_algorithm = (btCollisionAlgorithm *)0x0;
      ((anon_union_8_2_ea5a2114_for_btBroadphasePair_3 *)(&pbVar11[(int)uVar3].m_algorithm + 1))->
      m_internalInfo1 = (void *)0x0;
      gOverlappingPairs = gOverlappingPairs + 1;
      gAddedPairs = gAddedPairs + 1;
      pbVar6 = this->m_ghostPairCallback;
      if (pbVar6 == (btOverlappingPairCallback *)0x0) {
        return pbVar11 + (int)uVar3;
      }
      (*pbVar6->_vptr_btOverlappingPairCallback[2])(pbVar6,proxy0,proxy1);
      return pbVar11 + (int)uVar3;
    }
  }
  return (btBroadphasePair *)0x0;
}

Assistant:

btBroadphasePair*	btSortedOverlappingPairCache::addOverlappingPair(btBroadphaseProxy* proxy0,btBroadphaseProxy* proxy1)
{
	//don't add overlap with own
	btAssert(proxy0 != proxy1);

	if (!needsBroadphaseCollision(proxy0,proxy1))
		return 0;
	
	void* mem = &m_overlappingPairArray.expandNonInitializing();
	btBroadphasePair* pair = new (mem) btBroadphasePair(*proxy0,*proxy1);
	
	gOverlappingPairs++;
	gAddedPairs++;
	
	if (m_ghostPairCallback)
		m_ghostPairCallback->addOverlappingPair(proxy0, proxy1);
	return pair;
	
}